

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt * __thiscall llvm::APInt::operator++(APInt *this)

{
  WordType *dst;
  bool bVar1;
  uint parts;
  APInt *pAVar2;
  APInt *this_local;
  
  bVar1 = isSingleWord(this);
  if (bVar1) {
    (this->U).pVal = (uint64_t *)((this->U).VAL + 1);
  }
  else {
    dst = (this->U).pVal;
    parts = getNumWords(this);
    tcIncrement(dst,parts);
  }
  pAVar2 = clearUnusedBits(this);
  return pAVar2;
}

Assistant:

APInt& APInt::operator++() {
  if (isSingleWord())
    ++U.VAL;
  else
    tcIncrement(U.pVal, getNumWords());
  return clearUnusedBits();
}